

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  uint32_t uVar1;
  bool bVar2;
  PoolingLayerParams_ValidCompletePadding *this_00;
  SamePadding *this_01;
  ValidPadding *this_02;
  undefined1 *puVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_003fdec8;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar2 = from->globalpooling_;
  this->avgpoolexcludepadding_ = from->avgpoolexcludepadding_;
  this->globalpooling_ = bVar2;
  this->type_ = from->type_;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 0x1e) {
    this_02 = _internal_mutable_valid(this);
    if (from->_oneof_case_[0] == 0x1e) {
      puVar3 = (undefined1 *)(from->PoolingPaddingType_).valid_;
    }
    else {
      puVar3 = _ValidPadding_default_instance_;
    }
    ValidPadding::MergeFrom(this_02,(ValidPadding *)puVar3);
  }
  else if (uVar1 == 0x1f) {
    this_01 = _internal_mutable_same(this);
    if (from->_oneof_case_[0] == 0x1f) {
      puVar3 = (undefined1 *)(from->PoolingPaddingType_).same_;
    }
    else {
      puVar3 = _SamePadding_default_instance_;
    }
    SamePadding::MergeFrom(this_01,(SamePadding *)puVar3);
  }
  else if (uVar1 == 0x20) {
    this_00 = _internal_mutable_includelastpixel(this);
    if (from->_oneof_case_[0] == 0x20) {
      puVar3 = (undefined1 *)(from->PoolingPaddingType_).includelastpixel_;
    }
    else {
      puVar3 = _PoolingLayerParams_ValidCompletePadding_default_instance_;
    }
    PoolingLayerParams_ValidCompletePadding::MergeFrom
              (this_00,(PoolingLayerParams_ValidCompletePadding *)puVar3);
  }
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams(const PoolingLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    static_cast<size_t>(reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_)) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      _internal_mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from._internal_valid());
      break;
    }
    case kSame: {
      _internal_mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from._internal_same());
      break;
    }
    case kIncludeLastPixel: {
      _internal_mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from._internal_includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams)
}